

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O3

Vector __thiscall
anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>::point_at
          (Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_> *this,double u,double v)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long in_RSI;
  double dVar2;
  double extraout_XMM0_Qa;
  Vector VVar3;
  
  plVar1 = *(long **)(*(long *)(in_RSI + 8) + 0x28);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)(in_RSI + 8) + 0x30);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar2 = (double)(**(code **)(*plVar1 + 0x30))(this);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    dVar2 = extraout_XMM0_Qa;
  }
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1] = v;
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0] =
       dVar2;
  return (Vector)VVar3.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
                 .array;
}

Assistant:

Vector point_at(const double u, const double v) const override
    {
        return m_surface_geometry->point_at(u, v);
    }